

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getBinaryLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint uVar1;
  byte *pbVar2;
  ulong uVar3;
  Exception *this_00;
  ulong uVar4;
  
  pbVar2 = *(byte **)this;
  if ((*pbVar2 & 0xf8) != 0xc0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,InvalidValueType,"Expecting type Binary");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  switch(*pbVar2) {
  case 0xc0:
    return (ulong)pbVar2[1];
  case 0xc1:
    return (ulong)*(ushort *)(pbVar2 + 1);
  case 0xc2:
    uVar4 = (ulong)((uint)pbVar2[2] << 8 | (uint)pbVar2[3] << 0x10);
    uVar3 = (ulong)pbVar2[1];
    break;
  case 0xc3:
    return (ulong)*(uint *)(pbVar2 + 1);
  case 0xc4:
    uVar1 = *(uint *)(pbVar2 + 1);
    uVar3 = (ulong)pbVar2[5];
    goto LAB_0010fb9c;
  case 0xc5:
    uVar1 = *(uint *)(pbVar2 + 1);
    uVar3 = (ulong)*(ushort *)(pbVar2 + 5);
LAB_0010fb9c:
    return uVar3 << 0x20 | (ulong)uVar1;
  case 0xc6:
    uVar4 = (ulong)*(uint3 *)(pbVar2 + 5) << 0x20;
    uVar3 = (ulong)*(uint *)(pbVar2 + 1);
    break;
  case 199:
    return *(ValueLength *)(pbVar2 + 1);
  default:
    return 0;
  }
  return uVar3 | uVar4;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }